

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

int __thiscall QAccessibleTable::selectedRowCount(QAccessibleTable *this)

{
  QAbstractItemView *pQVar1;
  QItemSelectionModel *pQVar2;
  QAccessibleObject *pQVar3;
  long in_FS_OFFSET;
  QArrayData *local_30 [2];
  int local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar3);
  pQVar1 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar2 = QAbstractItemView::selectionModel(pQVar1);
  if (pQVar2 == (QItemSelectionModel *)0x0) {
    local_20 = 0;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x18))(pQVar3);
    pQVar1 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject)
    ;
    QAbstractItemView::selectionModel(pQVar1);
    QItemSelectionModel::selectedRows((int)local_30);
    if (local_30[0] != (QArrayData *)0x0) {
      LOCK();
      (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30[0],0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::selectedRowCount() const
{
    if (!view()->selectionModel())
        return 0;
    return view()->selectionModel()->selectedRows().size();
}